

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

word256 * mm256_parity_3(word256 v1,word256 v2,word256 v3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar24 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar25 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  word256 total3;
  word256 total2;
  word256 total1;
  word256 popcnt6;
  word256 popcnt5;
  word256 hi3;
  word256 lo3;
  word256 popcnt4;
  word256 popcnt3;
  word256 hi2;
  word256 lo2;
  word256 popcnt2;
  word256 popcnt1;
  word256 hi1;
  word256 lo1;
  word256 all1;
  word256 low_mask;
  word256 lookup;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,2,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,2,5);
  auVar1 = vpinsrb_avx(auVar1,2,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,2,9);
  auVar1 = vpinsrb_avx(auVar1,2,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,2,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  auVar1 = vpinsrb_avx(auVar1,4,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,2,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,2,5);
  auVar2 = vpinsrb_avx(auVar2,2,6);
  auVar2 = vpinsrb_avx(auVar2,3,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,2,9);
  auVar2 = vpinsrb_avx(auVar2,2,10);
  auVar2 = vpinsrb_avx(auVar2,3,0xb);
  auVar2 = vpinsrb_avx(auVar2,2,0xc);
  auVar2 = vpinsrb_avx(auVar2,3,0xd);
  auVar2 = vpinsrb_avx(auVar2,3,0xe);
  auVar2 = vpinsrb_avx(auVar2,4,0xf);
  uStack_90 = auVar2._0_8_;
  uStack_88 = auVar2._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar2 = vpinsrb_avx(auVar2,0xf,2);
  auVar2 = vpinsrb_avx(auVar2,0xf,3);
  auVar2 = vpinsrb_avx(auVar2,0xf,4);
  auVar2 = vpinsrb_avx(auVar2,0xf,5);
  auVar2 = vpinsrb_avx(auVar2,0xf,6);
  auVar2 = vpinsrb_avx(auVar2,0xf,7);
  auVar2 = vpinsrb_avx(auVar2,0xf,8);
  auVar2 = vpinsrb_avx(auVar2,0xf,9);
  auVar2 = vpinsrb_avx(auVar2,0xf,10);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xf);
  auVar25 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar25 = vpinsrb_avx(auVar25,0xf,2);
  auVar25 = vpinsrb_avx(auVar25,0xf,3);
  auVar25 = vpinsrb_avx(auVar25,0xf,4);
  auVar25 = vpinsrb_avx(auVar25,0xf,5);
  auVar25 = vpinsrb_avx(auVar25,0xf,6);
  auVar25 = vpinsrb_avx(auVar25,0xf,7);
  auVar25 = vpinsrb_avx(auVar25,0xf,8);
  auVar25 = vpinsrb_avx(auVar25,0xf,9);
  auVar25 = vpinsrb_avx(auVar25,0xf,10);
  auVar25 = vpinsrb_avx(auVar25,0xf,0xb);
  auVar25 = vpinsrb_avx(auVar25,0xf,0xc);
  auVar25 = vpinsrb_avx(auVar25,0xf,0xd);
  auVar25 = vpinsrb_avx(auVar25,0xf,0xe);
  auVar25 = vpinsrb_avx(auVar25,0xf,0xf);
  uStack_d0 = auVar25._0_8_;
  uStack_c8 = auVar25._8_8_;
  auVar25 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
  auVar24 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
  auVar24 = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar24;
  auVar25 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
  uStack_4b0 = auVar25._0_8_;
  uStack_4a8 = auVar25._8_8_;
  auVar14._8_8_ = in_XMM0_Qb;
  auVar14._0_8_ = in_XMM0_Qa;
  auVar14._16_8_ = in_YMM0_H;
  auVar14._24_8_ = in_register_00001218;
  auVar13._16_8_ = uStack_d0;
  auVar13._0_16_ = auVar2;
  auVar13._24_8_ = uStack_c8;
  auVar3 = vpand_avx2(auVar14,auVar13);
  auVar17._8_8_ = in_XMM0_Qb;
  auVar17._0_8_ = in_XMM0_Qa;
  auVar17._16_8_ = in_YMM0_H;
  auVar17._24_8_ = in_register_00001218;
  auVar9 = vpsrld_avx2(auVar17,ZEXT416(4));
  auVar12._16_8_ = uStack_d0;
  auVar12._0_16_ = auVar2;
  auVar12._24_8_ = uStack_c8;
  auVar9 = vpand_avx2(auVar9,auVar12);
  auVar23._16_8_ = uStack_90;
  auVar23._0_16_ = auVar1;
  auVar23._24_8_ = uStack_88;
  auVar4 = vpshufb_avx2(auVar23,auVar3);
  auVar22._16_8_ = uStack_90;
  auVar22._0_16_ = auVar1;
  auVar22._24_8_ = uStack_88;
  auVar5 = vpshufb_avx2(auVar22,auVar9);
  auVar11._8_8_ = in_XMM1_Qb;
  auVar11._0_8_ = in_XMM1_Qa;
  auVar11._16_8_ = in_YMM1_H;
  auVar11._24_8_ = in_register_00001258;
  auVar7._16_8_ = uStack_d0;
  auVar7._0_16_ = auVar2;
  auVar7._24_8_ = uStack_c8;
  auVar3 = vpand_avx2(auVar11,auVar7);
  auVar16._8_8_ = in_XMM1_Qb;
  auVar16._0_8_ = in_XMM1_Qa;
  auVar16._16_8_ = in_YMM1_H;
  auVar16._24_8_ = in_register_00001258;
  auVar9 = vpsrld_avx2(auVar16,ZEXT416(4));
  auVar6._16_8_ = uStack_d0;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_c8;
  auVar9 = vpand_avx2(auVar9,auVar6);
  auVar21._16_8_ = uStack_90;
  auVar21._0_16_ = auVar1;
  auVar21._24_8_ = uStack_88;
  auVar6 = vpshufb_avx2(auVar21,auVar3);
  auVar20._16_8_ = uStack_90;
  auVar20._0_16_ = auVar1;
  auVar20._24_8_ = uStack_88;
  auVar7 = vpshufb_avx2(auVar20,auVar9);
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = in_XMM2_Qa;
  auVar9._16_8_ = in_YMM2_H;
  auVar9._24_8_ = in_register_00001298;
  auVar3._16_8_ = uStack_d0;
  auVar3._0_16_ = auVar2;
  auVar3._24_8_ = uStack_c8;
  auVar3 = vpand_avx2(auVar9,auVar3);
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = in_XMM2_Qa;
  auVar15._16_8_ = in_YMM2_H;
  auVar15._24_8_ = in_register_00001298;
  auVar9 = vpsrld_avx2(auVar15,ZEXT416(4));
  auVar8._16_8_ = uStack_d0;
  auVar8._0_16_ = auVar2;
  auVar8._24_8_ = uStack_c8;
  auVar9 = vpand_avx2(auVar9,auVar8);
  auVar19._16_8_ = uStack_90;
  auVar19._0_16_ = auVar1;
  auVar19._24_8_ = uStack_88;
  auVar8 = vpshufb_avx2(auVar19,auVar3);
  auVar18._16_8_ = uStack_90;
  auVar18._0_16_ = auVar1;
  auVar18._24_8_ = uStack_88;
  auVar9 = vpshufb_avx2(auVar18,auVar9);
  auVar3 = vpsadbw_avx2(auVar4,auVar5);
  auVar10._16_8_ = uStack_4b0;
  auVar10._0_16_ = auVar24;
  auVar10._24_8_ = uStack_4a8;
  vpand_avx2(auVar3,auVar10);
  auVar3 = vpsadbw_avx2(auVar6,auVar7);
  auVar5._16_8_ = uStack_4b0;
  auVar5._0_16_ = auVar24;
  auVar5._24_8_ = uStack_4a8;
  auVar3 = vpand_avx2(auVar3,auVar5);
  auVar9 = vpsadbw_avx2(auVar8,auVar9);
  auVar4._16_8_ = uStack_4b0;
  auVar4._0_16_ = auVar24;
  auVar4._24_8_ = uStack_4a8;
  auVar9 = vpand_avx2(auVar9,auVar4);
  vpsllq_avx2(auVar3,ZEXT416(1));
  vpsllq_avx2(auVar9,ZEXT416(2));
  return (word256 *)0x2;
}

Assistant:

ATTR_TARGET_AVX2
static inline word256 mm256_parity_3(word256 v1, word256 v2, word256 v3) {
  const word256 lookup   = _mm256_setr_epi8(0, 1, 1, 2, 1, 2, 2, 3, 1, 2, 2, 3, 2, 3, 3, 4, 0, 1, 1,
                                            2, 1, 2, 2, 3, 1, 2, 2, 3, 2, 3, 3, 4);
  const word256 low_mask = _mm256_set1_epi8(0x0f);
  const word256 all1     = _mm256_set1_epi64x(0x1);

  const word256 lo1     = mm256_and(v1, low_mask);
  const word256 hi1     = mm256_and(_mm256_srli_epi32(v1, 4), low_mask);
  const word256 popcnt1 = _mm256_shuffle_epi8(lookup, lo1);
  const word256 popcnt2 = _mm256_shuffle_epi8(lookup, hi1);

  const word256 lo2     = mm256_and(v2, low_mask);
  const word256 hi2     = mm256_and(_mm256_srli_epi32(v2, 4), low_mask);
  const word256 popcnt3 = _mm256_shuffle_epi8(lookup, lo2);
  const word256 popcnt4 = _mm256_shuffle_epi8(lookup, hi2);

  const word256 lo3     = mm256_and(v3, low_mask);
  const word256 hi3     = mm256_and(_mm256_srli_epi32(v3, 4), low_mask);
  const word256 popcnt5 = _mm256_shuffle_epi8(lookup, lo3);
  const word256 popcnt6 = _mm256_shuffle_epi8(lookup, hi3);

  const word256 total1 = mm256_and(_mm256_sad_epu8(popcnt1, popcnt2), all1);
  const word256 total2 = mm256_and(_mm256_sad_epu8(popcnt3, popcnt4), all1);
  const word256 total3 = mm256_and(_mm256_sad_epu8(popcnt5, popcnt6), all1);

  return mm256_xor(mm256_xor(total1, _mm256_slli_epi64(total2, 1)), _mm256_slli_epi64(total3, 2));
}